

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

int Saig_ManBmcReduceTruth(int uTruth,int *Lits)

{
  int iVar1;
  int local_1c;
  int v;
  int *Lits_local;
  int uTruth_local;
  
  Lits_local._4_4_ = uTruth;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    if (Lits[local_1c] == 0) {
      Lits_local._4_4_ = Saig_ManBmcCof0(Lits_local._4_4_,local_1c);
      Lits[local_1c] = -1;
    }
    else if (Lits[local_1c] == 1) {
      Lits_local._4_4_ = Saig_ManBmcCof1(Lits_local._4_4_,local_1c);
      Lits[local_1c] = -1;
    }
  }
  local_1c = 0;
  do {
    if (3 < local_1c) {
      return Lits_local._4_4_;
    }
    if (Lits[local_1c] == -1) {
      iVar1 = Saig_ManBmcCofEqual(Lits_local._4_4_,local_1c);
      if (iVar1 == 0) {
        __assert_fail("Saig_ManBmcCofEqual(uTruth, v)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc3.c"
                      ,0x3b2,"int Saig_ManBmcReduceTruth(int, int *)");
      }
    }
    else {
      iVar1 = Saig_ManBmcCofEqual(Lits_local._4_4_,local_1c);
      if (iVar1 != 0) {
        Lits[local_1c] = -1;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static inline int Saig_ManBmcReduceTruth( int uTruth, int Lits[] )
{
    int v;
    for ( v = 0; v < 4; v++ )
        if ( Lits[v] == 0 )
        {
            uTruth = Saig_ManBmcCof0(uTruth, v);
            Lits[v] = -1;
        }
        else if ( Lits[v] == 1 )
        {
            uTruth = Saig_ManBmcCof1(uTruth, v);
            Lits[v] = -1;
        }
    for ( v = 0; v < 4; v++ )
        if ( Lits[v] == -1 )
            assert( Saig_ManBmcCofEqual(uTruth, v) );
        else if ( Saig_ManBmcCofEqual(uTruth, v) )
            Lits[v] = -1;
    return uTruth;
}